

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O1

DdNode * Cudd_bddAdjPermuteX(DdManager *dd,DdNode *B,DdNode **x,int n)

{
  int iVar1;
  DdHalfWord DVar2;
  DdHalfWord DVar3;
  int *permut;
  long lVar4;
  DdNode *pDVar5;
  
  iVar1 = dd->size;
  permut = (int *)malloc((long)iVar1 * 4);
  if (permut == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    pDVar5 = (DdNode *)0x0;
  }
  else {
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        permut[lVar4] = (int)lVar4;
        lVar4 = lVar4 + 1;
      } while (iVar1 != lVar4);
    }
    if (2 < n) {
      lVar4 = 0;
      do {
        DVar2 = x[lVar4]->index;
        DVar3 = x[lVar4 + 1]->index;
        permut[(int)DVar2] = DVar3;
        permut[(int)DVar3] = DVar2;
        lVar4 = lVar4 + 3;
      } while (lVar4 < n + -2);
    }
    pDVar5 = Cudd_bddPermute(dd,B,permut);
    free(permut);
  }
  return pDVar5;
}

Assistant:

DdNode *
Cudd_bddAdjPermuteX(
  DdManager * dd,
  DdNode * B,
  DdNode ** x,
  int  n)
{
    DdNode *swapped;
    int  i, j, k;
    int  *permut;

    permut = ABC_ALLOC(int,dd->size);
    if (permut == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < dd->size; i++) permut[i] = i;
    for (i = 0; i < n-2; i += 3) {
        j = x[i]->index;
        k = x[i+1]->index;
        permut[j] = k;
        permut[k] = j;
    }

    swapped = Cudd_bddPermute(dd,B,permut);
    ABC_FREE(permut);

    return(swapped);

}